

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void __thiscall Assimp::JSONWriter::JSONWriter(JSONWriter *this,IOStream *out,uint flags)

{
  locale local_40 [8];
  locale local_38 [28];
  uint local_1c;
  IOStream *pIStack_18;
  uint flags_local;
  IOStream *out_local;
  JSONWriter *this_local;
  
  this->out = out;
  local_1c = flags;
  pIStack_18 = out;
  out_local = (IOStream *)this;
  std::__cxx11::string::string((string *)&this->indent);
  std::__cxx11::string::string((string *)&this->newline);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->buff);
  this->first = false;
  this->flags = local_1c;
  std::locale::locale(local_40,"C");
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  std::locale::~locale(local_40);
  return;
}

Assistant:

JSONWriter(Assimp::IOStream& out, unsigned int flags = 0u)
    : out(out)
    , first()
    , flags(flags) {
        // make sure that all formatting happens using the standard, C locale and not the user's current locale
        buff.imbue(std::locale("C"));
    }